

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  LibraryHandle __s;
  bool bVar1;
  cmDynamicLoaderCache *pcVar2;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  LibraryHandle lh;
  char *libname_local;
  
  lh = libname;
  pcVar2 = anon_unknown.dwarf_51a2c7::cmDynamicLoaderCache::GetInstance();
  bVar1 = anon_unknown.dwarf_51a2c7::cmDynamicLoaderCache::GetCacheFile(pcVar2,(char *)lh,&local_20)
  ;
  __s = lh;
  if (bVar1) {
    libname_local = local_20;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)__s,&local_41);
    local_20 = (char *)cmsys::DynamicLoader::OpenLibrary(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    pcVar2 = anon_unknown.dwarf_51a2c7::cmDynamicLoaderCache::GetInstance();
    anon_unknown.dwarf_51a2c7::cmDynamicLoaderCache::CacheFile(pcVar2,(char *)lh,local_20);
    libname_local = local_20;
  }
  return libname_local;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname)
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if (cmDynamicLoaderCache::GetInstance().GetCacheFile(libname, lh)) {
    return lh;
  }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance().CacheFile(libname, lh);
  return lh;
}